

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

TimedStatement * __thiscall
slang::BumpAllocator::
emplace<slang::ast::TimedStatement,slang::ast::TimingControl&,slang::ast::Statement_const&,slang::SourceRange>
          (BumpAllocator *this,TimingControl *args,Statement *args_1,SourceRange *args_2)

{
  SourceLocation SVar1;
  SourceLocation SVar2;
  TimedStatement *pTVar3;
  
  pTVar3 = (TimedStatement *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((TimedStatement *)this->endPtr < pTVar3 + 1) {
    pTVar3 = (TimedStatement *)allocateSlow(this,0x30,8);
  }
  else {
    this->head->current = (byte *)(pTVar3 + 1);
  }
  SVar1 = args_2->startLoc;
  SVar2 = args_2->endLoc;
  (pTVar3->super_Statement).kind = Timed;
  (pTVar3->super_Statement).syntax = (StatementSyntax *)0x0;
  (pTVar3->super_Statement).sourceRange.startLoc = SVar1;
  (pTVar3->super_Statement).sourceRange.endLoc = SVar2;
  pTVar3->timing = args;
  pTVar3->stmt = args_1;
  return pTVar3;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }